

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall
H264StreamReader::detectPrimaryPicType(H264StreamReader *this,SliceUnit *firstSlice,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  byte *buffer;
  int unaff_EBP;
  SliceUnit slice;
  SliceUnit local_a0;
  
  SliceUnit::SliceUnit(&local_a0);
  *(undefined2 *)&(this->super_MPEGStreamReader).field_0xda = 0;
  this->m_pict_type = -1;
  iVar2 = sliceTypeToPictType(this,firstSlice->slice_type);
  this->m_pict_type = iVar2;
  buffer = NALUnit::findNextNAL
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  if (buffer == (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
    unaff_EBP = -10;
    if ((this->super_MPEGStreamReader).m_eof != false) {
      unaff_EBP = 0;
    }
  }
  else {
    do {
      if (((*buffer & 0x1f) - 1 < 5) || ((*buffer & 0x1f) == 0x14)) {
        iVar2 = SliceUnit::deserializeSliceType
                          (&local_a0,buffer,
                           (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
        if (iVar2 != 0) goto LAB_00189297;
        if (local_a0.first_mb_in_slice != 0) {
          iVar2 = sliceTypeToPictType(this,local_a0.slice_type);
          if (iVar2 < this->m_pict_type) {
            iVar2 = this->m_pict_type;
          }
          this->m_pict_type = iVar2;
          goto LAB_001892d5;
        }
        (this->super_MPEGStreamReader).field_0xda = 1;
        bVar1 = SliceUnit::isIDR(&local_a0);
        (this->super_MPEGStreamReader).field_0xdb = bVar1;
        iVar2 = 0;
        unaff_EBP = 0;
      }
      else {
LAB_001892d5:
        buffer = NALUnit::findNextNAL
                           (buffer,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd);
        iVar2 = 1;
        if (buffer == (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
LAB_00189297:
          iVar2 = 0;
          unaff_EBP = -10;
          if ((this->super_MPEGStreamReader).m_eof != false) {
            unaff_EBP = iVar2;
          }
        }
      }
    } while ((char)iVar2 != '\0');
  }
  local_a0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00242058;
  if (local_a0.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_a0.super_NALUnit.m_nalBuffer);
  }
  return unaff_EBP;
}

Assistant:

int H264StreamReader::detectPrimaryPicType(const SliceUnit &firstSlice, uint8_t *buff)
{
    SliceUnit slice;
    m_nextFrameFound = false;
    m_nextFrameIdr = false;
    m_pict_type = -1;
    m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(firstSlice.slice_type));

    uint8_t *nextSlice = NALUnit::findNextNAL(buff, m_bufEnd);
    if (nextSlice == m_bufEnd)
    {
        return m_eof ? 0 : NOT_ENOUGH_BUFFER;
    }

    while (true)
    {
        const int nalUnitType = *nextSlice;
        switch (static_cast<NALUnit::NALType>(nalUnitType & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (slice.deserializeSliceType(nextSlice, m_bufEnd) != 0)
            {
                return m_eof ? 0 : NOT_ENOUGH_BUFFER;
            }

            if (slice.first_mb_in_slice == 0)
            {
                m_nextFrameFound = true;
                m_nextFrameIdr = slice.isIDR();
                return 0;  // next frame found
            }
            m_pict_type = (std::max)(m_pict_type, sliceTypeToPictType(slice.slice_type));
            break;
        default:
            break;
        }
        nextSlice = NALUnit::findNextNAL(nextSlice, m_bufEnd);
        if (nextSlice == m_bufEnd)
        {
            return m_eof ? 0 : NOT_ENOUGH_BUFFER;
        }
    }
}